

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

void * trico_open_archive_for_writing(uint64_t initial_buffer_size)

{
  int iVar1;
  uint8_t *puVar2;
  trico_archive *arch;
  uint64_t initial_buffer_size_local;
  
  initial_buffer_size_local = (uint64_t)trico_malloc(0x48);
  ((trico_archive *)initial_buffer_size_local)->buffer = (uint8_t *)0x0;
  ((trico_archive *)initial_buffer_size_local)->buffer_pointer = (uint8_t *)0x0;
  ((trico_archive *)initial_buffer_size_local)->data = (uint8_t *)0x0;
  ((trico_archive *)initial_buffer_size_local)->data_pointer = (uint8_t *)0x0;
  ((trico_archive *)initial_buffer_size_local)->version = 0;
  ((trico_archive *)initial_buffer_size_local)->next_stream_type = trico_empty;
  ((trico_archive *)initial_buffer_size_local)->buffer_size = 0;
  ((trico_archive *)initial_buffer_size_local)->data_size = 0;
  ((trico_archive *)initial_buffer_size_local)->size_available = 0;
  ((trico_archive *)initial_buffer_size_local)->writable = 0;
  puVar2 = (uint8_t *)trico_malloc(initial_buffer_size);
  ((trico_archive *)initial_buffer_size_local)->buffer = puVar2;
  if (((trico_archive *)initial_buffer_size_local)->buffer == (uint8_t *)0x0) {
    trico_free((void *)initial_buffer_size_local);
    initial_buffer_size_local = 0;
  }
  else {
    ((trico_archive *)initial_buffer_size_local)->buffer_pointer =
         ((trico_archive *)initial_buffer_size_local)->buffer;
    ((trico_archive *)initial_buffer_size_local)->buffer_size = initial_buffer_size;
    ((trico_archive *)initial_buffer_size_local)->size_available = initial_buffer_size;
    ((trico_archive *)initial_buffer_size_local)->writable = 1;
    iVar1 = write_header((trico_archive *)initial_buffer_size_local);
    if (iVar1 == 0) {
      trico_free((void *)initial_buffer_size_local);
      initial_buffer_size_local = 0;
    }
  }
  return (void *)initial_buffer_size_local;
}

Assistant:

void* trico_open_archive_for_writing(uint64_t initial_buffer_size)
  {
  struct trico_archive* arch = (struct trico_archive*)trico_malloc(sizeof(struct trico_archive));
  arch->buffer = NULL;
  arch->buffer_pointer = NULL;
  arch->data = NULL;
  arch->data_pointer = NULL;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->writable = 0;

  arch->buffer = (uint8_t*)trico_malloc(initial_buffer_size);
  if (!arch->buffer)
    {
    trico_free(arch);
    return NULL;
    }
  arch->buffer_pointer = arch->buffer;
  arch->buffer_size = initial_buffer_size;
  arch->size_available = initial_buffer_size;
  arch->writable = 1;
  if (write_header(arch) == 0)
    {
    trico_free(arch);
    return NULL;
    }
  return arch;
  }